

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O2

void parse_charstrings(T1_Face face,T1_Loader loader)

{
  PS_TableRec *pPVar1;
  byte bVar2;
  FT_Memory memory;
  undefined8 *puVar3;
  FT_Byte *pFVar4;
  byte *pbVar5;
  byte *pbVar6;
  ulong __n;
  PS_Table pPVar7;
  undefined4 uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  FT_Error FVar12;
  FT_Pointer __dest;
  ulong uVar14;
  byte *pbVar15;
  uint uVar16;
  long lVar17;
  FT_Error local_80;
  int local_7c;
  int local_78;
  uint local_74;
  PS_Table local_70;
  PS_Table local_68;
  FT_Byte notdef_glyph [5];
  undefined3 uStack_5b;
  FT_Byte *base;
  FT_Long FVar13;
  
  memory = (loader->parser).root.memory;
  puVar3 = (undefined8 *)face->psaux;
  pFVar4 = (loader->parser).root.cursor;
  pbVar5 = (loader->parser).root.limit;
  FVar13 = (*(loader->parser).root.funcs.to_int)((PS_Parser)loader);
  uVar9 = (uint)FVar13;
  FVar12 = 3;
  if (-1 < (int)uVar9) {
    lVar17 = (long)pbVar5 - (long)pFVar4 >> 3;
    uVar16 = (uint)lVar17;
    if ((long)(ulong)(uVar9 & 0x7fffffff) <= lVar17) {
      uVar16 = uVar9;
    }
    if (uVar16 == 0) {
      return;
    }
    if ((loader->parser).root.error != 0) {
      return;
    }
    local_70 = &loader->charstrings;
    local_68 = &loader->glyph_names;
    pPVar1 = &loader->swap_table;
    if (loader->num_glyphs == 0) {
      FVar12 = (**(code **)*puVar3)(local_70,uVar16 + 6,memory);
      if (((FVar12 != 0) || (FVar12 = (**(code **)*puVar3)(local_68,uVar16 + 6,memory), FVar12 != 0)
          ) || (FVar12 = (**(code **)*puVar3)(pPVar1,4,memory), FVar12 != 0)) goto LAB_0017319d;
      local_80 = 0;
    }
    local_78 = 0;
    local_74 = 0;
    local_7c = 0;
    while( true ) {
      (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
      pbVar15 = (loader->parser).root.cursor;
      if (pbVar5 <= pbVar15) break;
      if (pbVar15 + 3 < pbVar5) {
        bVar2 = pbVar15[3];
        if ((((ulong)bVar2 < 0x3f) && ((0x5000832100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) ||
           ((bVar2 - 0x5b < 0x23 && ((0x500000005U >> ((ulong)(bVar2 - 0x5b) & 0x3f) & 1) != 0)))) {
          if (*pbVar15 == 0x65) {
            if ((pbVar15[1] == 0x6e) && (pbVar15[2] == 100)) break;
          }
          else if ((((*pbVar15 == 100) && (pbVar15[1] == 0x65)) && (pbVar15[2] == 0x66)) &&
                  (local_7c != 0)) goto LAB_00172eed;
        }
      }
      (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
      pbVar6 = (loader->parser).root.cursor;
      if (pbVar5 <= pbVar6) {
        FVar12 = 3;
        goto LAB_0017319d;
      }
      if ((loader->parser).root.error != 0) {
        return;
      }
      if (*pbVar15 == 0x2f) {
        if (pbVar5 <= pbVar15 + 2) {
LAB_00173094:
          local_80 = 3;
          FVar12 = local_80;
          goto LAB_0017319d;
        }
        iVar10 = read_binary_data(&loader->parser,(FT_ULong *)notdef_glyph,&base,
                                  ((face->root).internal)->incremental_interface !=
                                  (FT_Incremental_InterfaceRec *)0x0);
        iVar11 = local_7c;
        if (iVar10 == 0) {
          return;
        }
        if (loader->num_glyphs == 0) {
          pbVar15 = pbVar15 + 1;
          uVar14 = (long)pbVar6 - (long)pbVar15;
          local_80 = (*(loader->glyph_names).funcs.add)(local_68,local_7c,pbVar15,(int)uVar14 + 1);
          FVar12 = local_80;
          if (local_80 != 0) goto LAB_0017319d;
          (loader->glyph_names).elements[iVar11][uVar14 & 0xffffffff] = '\0';
          if (*pbVar15 == 0x2e) {
            iVar10 = strcmp(".notdef",(char *)(loader->glyph_names).elements[iVar11]);
            if (iVar10 == 0) {
              local_78 = local_7c;
            }
            local_74 = local_74 & 0xff;
            iVar11 = local_7c;
            if (iVar10 == 0) {
              local_74 = 1;
            }
          }
          uVar8 = notdef_glyph._0_4_;
          uVar14 = (ulong)(face->type1).private_dict.lenIV;
          if (((long)uVar14 < 0) || ((int)(uVar16 + 5) <= iVar11)) {
            local_80 = (*(loader->charstrings).funcs.add)(local_70,iVar11,base,notdef_glyph._0_4_);
          }
          else {
            __n = CONCAT44(stack0xffffffffffffffa4,notdef_glyph._0_4_);
            if (__n <= uVar14) goto LAB_00173094;
            __dest = ft_mem_alloc(memory,__n,&local_80);
            FVar12 = local_80;
            if (local_80 != 0) goto LAB_0017319d;
            memcpy(__dest,base,__n);
            (*(code *)puVar3[4])(__dest,__n,0x10ea);
            iVar10 = (face->type1).private_dict.lenIV;
            local_80 = (*(loader->charstrings).funcs.add)
                                 (local_70,iVar11,(void *)((long)__dest + (long)iVar10),
                                  uVar8 - iVar10);
            ft_mem_free(memory,__dest);
          }
          FVar12 = local_80;
          if (local_80 != 0) goto LAB_0017319d;
          local_7c = local_7c + (uint)(local_80 == 0);
        }
      }
    }
    FVar12 = 3;
    if (local_7c != 0) {
LAB_00172eed:
      loader->num_glyphs = local_7c;
      if ((char)local_74 == '\0') {
        stack0xffffffffffffffa4 = CONCAT31(uStack_5b,0xe);
        notdef_glyph[0] = 0x8b;
        notdef_glyph[1] = 0xf7;
        notdef_glyph[2] = 0xe1;
        notdef_glyph[3] = '\r';
        FVar12 = (*(loader->swap_table).funcs.add)
                           (pPVar1,0,*(loader->glyph_names).elements,*(loader->glyph_names).lengths)
        ;
        if ((((FVar12 == 0) &&
             (local_80 = FVar12,
             FVar12 = (*(loader->swap_table).funcs.add)
                                (pPVar1,1,*(loader->charstrings).elements,
                                 *(loader->charstrings).lengths), pPVar7 = local_68, FVar12 == 0))
            && ((local_80 = FVar12,
                FVar12 = (*(loader->glyph_names).funcs.add)(local_68,0,".notdef",8), FVar12 == 0 &&
                ((local_80 = FVar12,
                 FVar12 = (*(loader->charstrings).funcs.add)(local_70,0,notdef_glyph,5),
                 iVar11 = local_7c, FVar12 == 0 &&
                 (local_80 = FVar12,
                 FVar12 = (*(loader->glyph_names).funcs.add)
                                    (pPVar7,local_7c,*(loader->swap_table).elements,
                                     *(loader->swap_table).lengths), FVar12 == 0)))))) &&
           (local_80 = FVar12,
           FVar12 = (*(loader->charstrings).funcs.add)
                              (local_70,iVar11,(loader->swap_table).elements[1],
                               (loader->swap_table).lengths[1]), FVar12 == 0)) {
          loader->num_glyphs = loader->num_glyphs + 1;
          return;
        }
      }
      else {
        pFVar4 = *(loader->glyph_names).elements;
        iVar11 = strcmp(".notdef",(char *)pFVar4);
        if (iVar11 == 0) {
          return;
        }
        FVar12 = (*(loader->swap_table).funcs.add)(pPVar1,0,pFVar4,*(loader->glyph_names).lengths);
        if ((FVar12 == 0) &&
           (local_80 = FVar12,
           FVar12 = (*(loader->swap_table).funcs.add)
                              (pPVar1,1,*(loader->charstrings).elements,
                               *(loader->charstrings).lengths), iVar11 = local_78, FVar12 == 0)) {
          lVar17 = (long)local_78;
          local_80 = FVar12;
          FVar12 = (*(loader->swap_table).funcs.add)
                             (pPVar1,2,(loader->glyph_names).elements[lVar17],
                              (loader->glyph_names).lengths[lVar17]);
          if (((FVar12 == 0) &&
              (((local_80 = FVar12,
                FVar12 = (*(loader->swap_table).funcs.add)
                                   (pPVar1,3,(loader->charstrings).elements[lVar17],
                                    (loader->charstrings).lengths[lVar17]), FVar12 == 0 &&
                (local_80 = FVar12,
                FVar12 = (*(loader->glyph_names).funcs.add)
                                   (local_68,iVar11,*(loader->swap_table).elements,
                                    *(loader->swap_table).lengths), FVar12 == 0)) &&
               (local_80 = FVar12,
               FVar12 = (*(loader->charstrings).funcs.add)
                                  (local_70,iVar11,(loader->swap_table).elements[1],
                                   (loader->swap_table).lengths[1]), FVar12 == 0)))) &&
             ((local_80 = FVar12,
              FVar12 = (*(loader->glyph_names).funcs.add)
                                 (local_68,0,(loader->swap_table).elements[2],
                                  (loader->swap_table).lengths[2]), FVar12 == 0 &&
              (local_80 = FVar12,
              FVar12 = (*(loader->charstrings).funcs.add)
                                 (local_70,0,(loader->swap_table).elements[3],
                                  (loader->swap_table).lengths[3]), FVar12 == 0)))) {
            return;
          }
        }
      }
    }
  }
LAB_0017319d:
  (loader->parser).root.error = FVar12;
  return;
}

Assistant:

static void
  parse_charstrings( T1_Face    face,
                     T1_Loader  loader )
  {
    T1_Parser      parser       = &loader->parser;
    PS_Table       code_table   = &loader->charstrings;
    PS_Table       name_table   = &loader->glyph_names;
    PS_Table       swap_table   = &loader->swap_table;
    FT_Memory      memory       = parser->root.memory;
    FT_Error       error;

    PSAux_Service  psaux        = (PSAux_Service)face->psaux;

    FT_Byte*       cur          = parser->root.cursor;
    FT_Byte*       limit        = parser->root.limit;
    FT_Int         n, num_glyphs;
    FT_Int         notdef_index = 0;
    FT_Byte        notdef_found = 0;


    num_glyphs = (FT_Int)T1_ToInt( parser );
    if ( num_glyphs < 0 )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    /* we certainly need more than 8 bytes per glyph */
    if ( num_glyphs > ( limit - cur ) >> 3 )
    {
      FT_TRACE0(( "parse_charstrings: adjusting number of glyphs"
                  " (from %d to %d)\n",
                  num_glyphs, ( limit - cur ) >> 3 ));
      num_glyphs = ( limit - cur ) >> 3;
    }

    /* some fonts like Optima-Oblique not only define the /CharStrings */
    /* array but access it also                                        */
    if ( num_glyphs == 0 || parser->root.error )
      return;

    /* initialize tables, leaving space for addition of .notdef, */
    /* if necessary, and a few other glyphs to handle buggy      */
    /* fonts which have more glyphs than specified.              */

    /* for some non-standard fonts like `Optima' which provides  */
    /* different outlines depending on the resolution it is      */
    /* possible to get here twice                                */
    if ( !loader->num_glyphs )
    {
      error = psaux->ps_table_funcs->init(
                code_table, num_glyphs + 1 + TABLE_EXTEND, memory );
      if ( error )
        goto Fail;

      error = psaux->ps_table_funcs->init(
                name_table, num_glyphs + 1 + TABLE_EXTEND, memory );
      if ( error )
        goto Fail;

      /* Initialize table for swapping index notdef_index and */
      /* index 0 names and codes (if necessary).              */

      error = psaux->ps_table_funcs->init( swap_table, 4, memory );
      if ( error )
        goto Fail;
    }

    n = 0;

    for (;;)
    {
      FT_ULong  size;
      FT_Byte*  base;


      /* the format is simple:        */
      /*   `/glyphname' + binary data */

      T1_Skip_Spaces( parser );

      cur = parser->root.cursor;
      if ( cur >= limit )
        break;

      /* we stop when we find a `def' or `end' keyword */
      if ( cur + 3 < limit && IS_PS_DELIM( cur[3] ) )
      {
        if ( cur[0] == 'd' &&
             cur[1] == 'e' &&
             cur[2] == 'f' )
        {
          /* There are fonts which have this: */
          /*                                  */
          /*   /CharStrings 118 dict def      */
          /*   Private begin                  */
          /*   CharStrings begin              */
          /*   ...                            */
          /*                                  */
          /* To catch this we ignore `def' if */
          /* no charstring has actually been  */
          /* seen.                            */
          if ( n )
            break;
        }

        if ( cur[0] == 'e' &&
             cur[1] == 'n' &&
             cur[2] == 'd' )
          break;
      }

      T1_Skip_PS_Token( parser );
      if ( parser->root.cursor >= limit )
      {
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }
      if ( parser->root.error )
        return;

      if ( *cur == '/' )
      {
        FT_UInt  len;


        if ( cur + 2 >= limit )
        {
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

        cur++;                              /* skip `/' */
        len = (FT_UInt)( parser->root.cursor - cur );

        if ( !read_binary_data( parser, &size, &base, IS_INCREMENTAL ) )
          return;

        /* for some non-standard fonts like `Optima' which provides */
        /* different outlines depending on the resolution it is     */
        /* possible to get here twice                               */
        if ( loader->num_glyphs )
          continue;

        error = T1_Add_Table( name_table, n, cur, len + 1 );
        if ( error )
          goto Fail;

        /* add a trailing zero to the name table */
        name_table->elements[n][len] = '\0';

        /* record index of /.notdef */
        if ( *cur == '.'                                              &&
             ft_strcmp( ".notdef",
                        (const char*)(name_table->elements[n]) ) == 0 )
        {
          notdef_index = n;
          notdef_found = 1;
        }

        if ( face->type1.private_dict.lenIV >= 0 &&
             n < num_glyphs + TABLE_EXTEND       )
        {
          FT_Byte*  temp = NULL;


          if ( size <= (FT_ULong)face->type1.private_dict.lenIV )
          {
            error = FT_THROW( Invalid_File_Format );
            goto Fail;
          }

          /* t1_decrypt() shouldn't write to base -- make temporary copy */
          if ( FT_ALLOC( temp, size ) )
            goto Fail;
          FT_MEM_COPY( temp, base, size );
          psaux->t1_decrypt( temp, size, 4330 );
          size -= (FT_ULong)face->type1.private_dict.lenIV;
          error = T1_Add_Table( code_table, n,
                                temp + face->type1.private_dict.lenIV, size );
          FT_FREE( temp );
        }
        else
          error = T1_Add_Table( code_table, n, base, size );
        if ( error )
          goto Fail;

        n++;
      }
    }

    if ( !n )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    loader->num_glyphs = n;

    /* if /.notdef is found but does not occupy index 0, do our magic. */
    if ( notdef_found                                                 &&
         ft_strcmp( ".notdef", (const char*)name_table->elements[0] ) )
    {
      /* Swap glyph in index 0 with /.notdef glyph.  First, add index 0  */
      /* name and code entries to swap_table.  Then place notdef_index   */
      /* name and code entries into swap_table.  Then swap name and code */
      /* entries at indices notdef_index and 0 using values stored in    */
      /* swap_table.                                                     */

      /* Index 0 name */
      error = T1_Add_Table( swap_table, 0,
                            name_table->elements[0],
                            name_table->lengths [0] );
      if ( error )
        goto Fail;

      /* Index 0 code */
      error = T1_Add_Table( swap_table, 1,
                            code_table->elements[0],
                            code_table->lengths [0] );
      if ( error )
        goto Fail;

      /* Index notdef_index name */
      error = T1_Add_Table( swap_table, 2,
                            name_table->elements[notdef_index],
                            name_table->lengths [notdef_index] );
      if ( error )
        goto Fail;

      /* Index notdef_index code */
      error = T1_Add_Table( swap_table, 3,
                            code_table->elements[notdef_index],
                            code_table->lengths [notdef_index] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, notdef_index,
                            swap_table->elements[0],
                            swap_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, notdef_index,
                            swap_table->elements[1],
                            swap_table->lengths [1] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, 0,
                            swap_table->elements[2],
                            swap_table->lengths [2] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, 0,
                            swap_table->elements[3],
                            swap_table->lengths [3] );
      if ( error )
        goto Fail;

    }
    else if ( !notdef_found )
    {
      /* notdef_index is already 0, or /.notdef is undefined in   */
      /* charstrings dictionary.  Worry about /.notdef undefined. */
      /* We take index 0 and add it to the end of the table(s)    */
      /* and add our own /.notdef glyph to index 0.               */

      /* 0 333 hsbw endchar */
      FT_Byte  notdef_glyph[] = { 0x8B, 0xF7, 0xE1, 0x0D, 0x0E };
      char*    notdef_name    = (char *)".notdef";


      error = T1_Add_Table( swap_table, 0,
                            name_table->elements[0],
                            name_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( swap_table, 1,
                            code_table->elements[0],
                            code_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, 0, notdef_name, 8 );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, 0, notdef_glyph, 5 );

      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, n,
                            swap_table->elements[0],
                            swap_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, n,
                            swap_table->elements[1],
                            swap_table->lengths [1] );
      if ( error )
        goto Fail;

      /* we added a glyph. */
      loader->num_glyphs += 1;
    }

    return;

  Fail:
    parser->root.error = error;
  }